

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t avx2_despace_branchless(char *bytes,size_t howmany)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  long lVar4;
  __m256i x;
  __m256i spaces;
  undefined8 in_RAX;
  uint uVar5;
  uint *in_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  ulong uVar6;
  undefined8 unaff_R12;
  longlong unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  longlong unaff_retaddr;
  undefined1 in_stack_00000008 [32];
  undefined1 in_stack_00000028 [32];
  uint maskhigh;
  uint masklow;
  
  maskhigh = (uint)in_RAX;
  masklow = (uint)((ulong)in_RAX >> 0x20);
  sVar7 = 0;
  for (uVar6 = 0; uVar6 + 0x1f < howmany; uVar6 = uVar6 + 0x20) {
    pcVar1 = bytes + uVar6;
    uVar8 = *(undefined8 *)pcVar1;
    uVar10 = *(undefined8 *)(pcVar1 + 8);
    uVar11 = *(undefined8 *)(pcVar1 + 0x10);
    uVar12 = *(undefined8 *)(pcVar1 + 0x18);
    x[0]._4_4_ = masklow;
    x[0]._0_4_ = maskhigh;
    x[1] = unaff_RBX;
    x[2] = unaff_R12;
    x[3] = unaff_R13;
    spaces[1] = unaff_R15;
    spaces[0] = unaff_R14;
    spaces[2] = unaff_RBP;
    spaces[3] = unaff_retaddr;
    cleanm256((__m256i *)&masklow,x,spaces,(__m256i)in_stack_00000008,(__m256i)in_stack_00000028,
              &maskhigh,in_RDX);
    in_RDX = (uint *)(bytes + sVar7);
    *(undefined8 *)(bytes + sVar7) = uVar8;
    *(undefined8 *)(bytes + sVar7 + 8) = uVar10;
    lVar4 = -(ulong)(uint)POPCOUNT(masklow);
    *(undefined8 *)((long)in_RDX + lVar4 + 0x20) = uVar11;
    *(undefined8 *)((long)in_RDX + lVar4 + 0x28) = uVar12;
    sVar7 = (long)(((int)lVar4 + 0x10) - POPCOUNT(maskhigh)) + 0x10 + sVar7;
  }
  auVar9[8] = 0x20;
  auVar9._0_8_ = 0x2020202020202020;
  auVar9[9] = 0x20;
  auVar9[10] = 0x20;
  auVar9[0xb] = 0x20;
  auVar9[0xc] = 0x20;
  auVar9[0xd] = 0x20;
  auVar9[0xe] = 0x20;
  auVar9[0xf] = 0x20;
  auVar13[8] = 10;
  auVar13._0_8_ = 0xa0a0a0a0a0a0a0a;
  auVar13[9] = 10;
  auVar13[10] = 10;
  auVar13[0xb] = 10;
  auVar13[0xc] = 10;
  auVar13[0xd] = 10;
  auVar13[0xe] = 10;
  auVar13[0xf] = 10;
  auVar14[8] = 0xd;
  auVar14._0_8_ = 0xd0d0d0d0d0d0d0d;
  auVar14[9] = 0xd;
  auVar14[10] = 0xd;
  auVar14[0xb] = 0xd;
  auVar14[0xc] = 0xd;
  auVar14[0xd] = 0xd;
  auVar14[0xe] = 0xd;
  auVar14[0xf] = 0xd;
  while (uVar6 + 0xf < howmany) {
    auVar2 = *(undefined1 (*) [16])(bytes + uVar6);
    uVar6 = uVar6 + 0x10;
    uVar8 = vpcmpeqb_avx512vl(auVar2,auVar9);
    uVar10 = vpcmpeqb_avx512vl(auVar2,auVar13);
    uVar11 = vpcmpeqb_avx512vl(auVar2,auVar14);
    uVar5 = (uint)(ushort)((ushort)uVar10 | (ushort)uVar8 | (ushort)uVar11);
    auVar2 = vpshufb_avx(auVar2,*(undefined1 (*) [16])("" + ((uVar5 & 0x7fff) << 4)));
    *(undefined1 (*) [16])(bytes + sVar7) = auVar2;
    sVar7 = sVar7 + (0x10 - POPCOUNT(uVar5));
  }
  for (; uVar6 < howmany; uVar6 = uVar6 + 1) {
    bVar3 = bytes[uVar6];
    if ((0x20 < (ulong)bVar3) || ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
      bytes[sVar7] = bVar3;
      sVar7 = sVar7 + 1;
    }
  }
  return sVar7;
}

Assistant:

size_t avx2_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');

  __m256i spaces256 = _mm256_set1_epi8(' ');
  __m256i newline256 = _mm256_set1_epi8('\n');
  __m256i carriage256 = _mm256_set1_epi8('\r');

  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    unsigned int masklow, maskhigh;
    x = cleanm256(x, spaces256, newline256, carriage256, &masklow, &maskhigh);
    int offset1 = 16 - _mm_popcnt_u32(masklow);
    int offset2 = 16 - _mm_popcnt_u32(maskhigh);
    _mm256_storeu2_m128i((__m128i *)(bytes + pos + offset1),
                         (__m128i *)(bytes + pos), x);
    pos += offset1 + offset2;
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}